

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int x509_parse_int(uchar **p,size_t n,int *res)

{
  byte *pbVar1;
  int iVar2;
  bool bVar3;
  
  *res = 0;
  iVar2 = 0;
  while( true ) {
    bVar3 = n == 0;
    n = n - 1;
    if (bVar3) {
      return 0;
    }
    pbVar1 = *p;
    if ((byte)(*pbVar1 - 0x3a) < 0xf6) break;
    *res = iVar2 * 10;
    *p = pbVar1 + 1;
    iVar2 = iVar2 * 10 + (uint)*pbVar1 + -0x30;
    *res = iVar2;
  }
  return -0x2400;
}

Assistant:

static int x509_parse_int( unsigned char **p, size_t n, int *res )
{
    *res = 0;

    for( ; n > 0; --n )
    {
        if( ( **p < '0') || ( **p > '9' ) )
            return ( MBEDTLS_ERR_X509_INVALID_DATE );

        *res *= 10;
        *res += ( *(*p)++ - '0' );
    }

    return( 0 );
}